

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_resampler_config *
ma_resampler_config_init
          (ma_resampler_config *__return_storage_ptr__,ma_format format,ma_uint32 channels,
          ma_uint32 sampleRateIn,ma_uint32 sampleRateOut,ma_resample_algorithm algorithm)

{
  if (__return_storage_ptr__ != (ma_resampler_config *)0x0) {
    *(undefined8 *)&__return_storage_ptr__->algorithm = 0;
    __return_storage_ptr__->pBackendVTable = (ma_resampling_backend_vtable *)0x0;
    __return_storage_ptr__->pBackendUserData = (void *)0x0;
    *(undefined8 *)&__return_storage_ptr__->linear = 0;
    __return_storage_ptr__->format = format;
    __return_storage_ptr__->channels = channels;
    __return_storage_ptr__->sampleRateIn = sampleRateIn;
    __return_storage_ptr__->sampleRateOut = sampleRateOut;
    __return_storage_ptr__->algorithm = algorithm;
    (__return_storage_ptr__->linear).lpfOrder = 4;
    return __return_storage_ptr__;
  }
  __assert_fail("sz == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O2/_deps/raylib-src/src/external/miniaudio.h"
                ,0x2fbb,"void ma_zero_memory_default(void *, size_t)");
}

Assistant:

static MA_INLINE void ma_zero_memory_default(void* p, size_t sz)
{
    if (p == NULL) {
        MA_ASSERT(sz == 0); /* If this is triggered there's an error with the calling code. */
        return;
    }

    if (sz > 0) {
        memset(p, 0, sz);
    }
}